

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_ext_key_usage(uchar **p,uchar *end,mbedtls_x509_sequence *ext_key_usage)

{
  int iVar1;
  int ret;
  mbedtls_x509_sequence *ext_key_usage_local;
  uchar *end_local;
  uchar **p_local;
  
  iVar1 = mbedtls_asn1_get_sequence_of(p,end,ext_key_usage,6);
  if (iVar1 == 0) {
    if ((ext_key_usage->buf).p == (uchar *)0x0) {
      p_local._4_4_ = -0x2564;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = iVar1 + -0x2500;
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_ext_key_usage( unsigned char **p,
                               const unsigned char *end,
                               mbedtls_x509_sequence *ext_key_usage)
{
    int ret;

    if( ( ret = mbedtls_asn1_get_sequence_of( p, end, ext_key_usage, MBEDTLS_ASN1_OID ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    /* Sequence length must be >= 1 */
    if( ext_key_usage->buf.p == NULL )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_INVALID_LENGTH );

    return( 0 );
}